

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

int RSA_get0_multi_prime_factors(RSA *r,BIGNUM **primes)

{
  int iVar1;
  long in_RSI;
  RSA_PRIME_INFO *pinfo;
  int i;
  int pnum;
  RSA_PRIME_INFO *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  iVar1 = RSA_get_multi_prime_extra_count
                    ((RSA *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      in_stack_ffffffffffffffd8 =
           sk_RSA_PRIME_INFO_value
                     ((stack_st_RSA_PRIME_INFO *)CONCAT44(iVar1,iVar2),
                      (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      *(BIGNUM **)(in_RSI + (long)iVar2 * 8) = in_stack_ffffffffffffffd8->r;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int RSA_get0_multi_prime_factors(const RSA *r, const BIGNUM *primes[])
{
    int pnum, i;
    RSA_PRIME_INFO *pinfo;

    if ((pnum = RSA_get_multi_prime_extra_count(r)) == 0)
        return 0;

    /*
     * return other primes
     * it's caller's responsibility to allocate oth_primes[pnum]
     */
    for (i = 0; i < pnum; i++) {
        pinfo = sk_RSA_PRIME_INFO_value(r->prime_infos, i);
        primes[i] = pinfo->r;
    }

    return 1;
}